

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O3

int mapCool(Layer *l,int *out,int x,int z,int w,int h)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  int *piVar7;
  
  iVar1 = (*l->p->getMap)(l->p,out,x + -1,z + -1,w + 2,h + 2);
  if (iVar1 == 0) {
    if (0 < h) {
      lVar2 = (long)w;
      piVar3 = out + lVar2 * 2 + 5;
      piVar4 = out + lVar2 + 4;
      lVar5 = 0;
      piVar7 = out;
      do {
        if (0 < w) {
          lVar6 = 0;
          do {
            iVar1 = piVar4[lVar6 + -1];
            if ((iVar1 == 1) &&
               (((((out[lVar6 + 1] == 3 || (piVar4[lVar6] == 3)) || (piVar4[lVar6 + -2] == 3)) ||
                 ((piVar3[lVar6] == 3 || (out[lVar6 + 1] == 4)))) ||
                ((piVar4[lVar6] == 4 ||
                 ((piVar4[lVar6 + -2] == 4 || (iVar1 = 1, piVar3[lVar6] == 4)))))))) {
              iVar1 = 2;
            }
            piVar7[lVar6] = iVar1;
            lVar6 = lVar6 + 1;
          } while (lVar2 != lVar6);
        }
        lVar5 = lVar5 + 1;
        piVar7 = piVar7 + lVar2;
        piVar3 = piVar3 + lVar2 + 2;
        out = out + lVar2 + 2;
        piVar4 = piVar4 + lVar2 + 2;
      } while (lVar5 != h);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mapCool(const Layer * l, int * out, int x, int z, int w, int h)
{
    int pX = x - 1;
    int pZ = z - 1;
    int64_t pW = w + 2;
    int64_t pH = h + 2;
    int64_t i, j;

    int err = l->p->getMap(l->p, out, pX, pZ, pW, pH);
    if unlikely(err != 0)
        return err;

    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            int v11 = out[i+1 + (j+1)*pW];

            if (v11 == Warm)
            {
                int v10 = out[i+1 + (j+0)*pW];
                int v21 = out[i+2 + (j+1)*pW];
                int v01 = out[i+0 + (j+1)*pW];
                int v12 = out[i+1 + (j+2)*pW];

                if (isAny4(Cold, v10, v21, v01, v12) || isAny4(Freezing, v10, v21, v01, v12))
                {
                    v11 = Lush;
                }
            }

            out[i + j*w] = v11;
        }
    }

    return 0;
}